

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_settings.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::proxy_settings::proxy_settings(proxy_settings *this,session_settings *sett)

{
  session_settings *sett_local;
  proxy_settings *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&this->username);
  ::std::__cxx11::string::string((string *)&this->password);
  this->type = none;
  this->port = 0;
  this->proxy_hostnames = true;
  this->proxy_peer_connections = true;
  this->proxy_tracker_connections = true;
  anon_unknown_3::init<libtorrent::aux::session_settings>(this,sett);
  return;
}

Assistant:

proxy_settings::proxy_settings(aux::session_settings const& sett)
{ init(*this, sett); }